

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Scene::update_selection(Scene *this,Vector2D *p,Matrix4x4 *worldTo3DH)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppSVar4;
  reference ppSVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *in_RDI;
  double dVar6;
  int i_2;
  int i_1;
  SceneObject *obj;
  iterator __end3;
  iterator __begin3;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *__range3;
  double newW;
  int i;
  int minI;
  double minW;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
  *in_stack_ffffffffffffff90;
  int local_58;
  int local_54;
  __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
  local_40 [2];
  double local_30;
  int local_28;
  int local_24;
  double local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = -1.0;
  local_24 = -1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_28 = 0; uVar2 = (ulong)local_28,
      sVar3 = std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
              ::size(in_RDI), uVar2 < sVar3; local_28 = local_28 + 1) {
    ppSVar4 = std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
              ::operator[](in_RDI,(long)local_28);
    dVar6 = local_20;
    (*(*ppSVar4)->_vptr_SceneObject[4])(*ppSVar4,local_10,local_18);
    if ((0.0 <= dVar6) && ((local_24 < 0 || (dVar6 < local_20)))) {
      local_24 = local_28;
      local_20 = dVar6;
    }
    local_30 = dVar6;
  }
  if (local_24 == -1) {
    local_40[0]._M_current =
         (SceneObject **)
         std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::
         begin(in_stack_ffffffffffffff88);
    std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::end
              (in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff90,
                              (__normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      ppSVar5 = __gnu_cxx::
                __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
                ::operator*(local_40);
      (*(*ppSVar5)->_vptr_SceneObject[7])();
      __gnu_cxx::
      __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
      ::operator++(local_40);
    }
  }
  else {
    for (local_54 = 0; local_54 < local_24; local_54 = local_54 + 1) {
      ppSVar4 = std::
                vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::
                operator[](in_RDI,(long)local_54);
      (*(*ppSVar4)->_vptr_SceneObject[7])();
    }
    ppSVar4 = std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
              ::operator[](in_RDI,(long)local_24);
    (*(*ppSVar4)->_vptr_SceneObject[5])();
    local_58 = local_24;
    while( true ) {
      local_58 = local_58 + 1;
      uVar2 = (ulong)local_58;
      sVar3 = std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
              ::size(in_RDI);
      if (sVar3 <= uVar2) break;
      ppSVar4 = std::
                vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::
                operator[](in_RDI,(long)local_58);
      (*(*ppSVar4)->_vptr_SceneObject[7])();
    }
  }
  *(int *)((long)&in_RDI[3].
                  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4) = local_24;
  return;
}

Assistant:

void Scene::update_selection(const Vector2D& p, const Matrix4x4& worldTo3DH) {
  double minW = -1.0;
  int minI = -1;
  for (int i = 0; i < objects.size(); i++) {
    double newW = objects[i]->test_selection(p, worldTo3DH, minW);
    if (newW >= 0.0 && (minI < 0 || newW < minW)) {
      minI = i;
      minW = newW;
    }
  }
  if (minI == -1) {
    for (SceneObject *obj : objects) {
      obj->invalidate_hover();
    }
  } else {
    for (int i = 0; i < minI; i++) {
      objects[i]->invalidate_hover();
    }
    objects[minI]->confirm_hover();
    for (int i = minI + 1; i < objects.size(); i++) {
      objects[i]->invalidate_hover();
    }
  }
  hoverIdx = minI;
}